

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O1

bool __thiscall Memory::RecyclerSweepManager::DoPartialCollectMode(RecyclerSweepManager *this)

{
  bool bVar1;
  
  if ((this->recycler->enablePartialCollect == true) &&
     ((this->recycler->autoHeap).unusedPartialCollectFreeBytes < 0x1000001)) {
    bVar1 = this->rescanRootBytes < 0x500001;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
RecyclerSweepManager::DoPartialCollectMode()
{
    if (!recycler->enablePartialCollect)
    {
        return false;
    }

    // If we exceed 16MB of unused memory in partial blocks, get out of partial collect to avoid
    // memory fragmentation.
    if (recycler->autoHeap.unusedPartialCollectFreeBytes > MaxUnusedPartialCollectFreeBytes)
    {
        return false;
    }

    return this->rescanRootBytes <= MaxPartialCollectRescanRootBytes;
}